

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_std_formatting.cpp
# Opt level: O2

bool equal<char,wchar_t>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s1,
                        basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                        *s2)

{
  __type _Var1;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_80,"UTF-8",&local_a1);
  booster::locale::conv::from_utf<char>(&local_60,s1,&local_80,default_method);
  std::__cxx11::string::string((string *)&local_a0,"UTF-8",&local_a2);
  booster::locale::conv::from_utf<wchar_t>(&local_40,s2,&local_a0,default_method);
  _Var1 = std::operator==(&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return _Var1;
}

Assistant:

bool equal(std::basic_string<C1> const &s1,std::basic_string<C2> const &s2)
{
    return booster::locale::conv::from_utf(s1,"UTF-8") == booster::locale::conv::from_utf(s2,"UTF-8");
}